

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

bool test_uintwide_t_edge::test_various_edge_operations(void)

{
  limb_type *plVar1;
  size_type sVar2;
  pointer pvVar3;
  bool bVar4;
  type_conflict3 tVar5;
  type_conflict3 tVar6;
  __type _Var7;
  __type _Var8;
  __type _Var9;
  __type _Var10;
  __type _Var11;
  __type _Var12;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar13;
  long lVar14;
  local_uint_type result_local;
  int local_51cc;
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  u_max_local;
  local_uint_type u_mid_local;
  local_uint_type u_three_quarter_effs_and_zeros_local;
  local_uint_type one_limb_effs_prior_to_half_and_zeros_local;
  local_uint_type u_one_quarter_effs_and_zeros_local;
  local_uint_type u_seven_and_effs_local;
  string str_one_quarter_effs_and_zeros;
  string str_three_quarter_effs_and_zeros;
  string str_seven_and_effs;
  boost_uint_type u_three_quarter_effs_and_zeros_boost;
  boost_uint_type one_limb_effs_prior_to_half_and_zeros_boost;
  local_derived_uint_type dt;
  boost_uint_type u_one_quarter_effs_and_zeros_boost;
  boost_uint_type u_mid_boost;
  boost_uint_type u_seven_and_effs_boost;
  boost_uint_type result_boost;
  data_type local_1868;
  number_type u_max_boost;
  data_type local_848;
  undefined8 local_48;
  
  std::
  numeric_limits<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>_>
  ::max();
  memcpy(&u_max_boost,&DAT_001b1ac0,0x810);
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  uintwide_t_backend(&result_local.m_backend);
  memset(&result_boost,0,0x800);
  result_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_limbs = 1;
  boost::multiprecision::operator*
            ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&u_seven_and_effs_boost,&u_max_local,&u_max_local);
  pvVar3 = result_local.m_backend.m_value.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  sVar2 = result_local.m_backend.m_value.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       u_seven_and_effs_boost.m_backend.
       super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
       .m_wrapper.m_data[1]._0_4_;
  u_seven_and_effs_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1]._0_4_ = sVar2;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)u_seven_and_effs_boost.m_backend.
                super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .m_wrapper.m_data[2];
  u_seven_and_effs_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = (limb_type)pvVar3;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_seven_and_effs_boost);
  boost::multiprecision::operator*(&u_seven_and_effs_boost,&u_max_boost,&u_max_boost);
  memcpy(&result_boost,&u_seven_and_effs_boost,0x808);
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  uintwide_t_backend<unsigned_long,_nullptr>
            ((uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *)
             &u_three_quarter_effs_and_zeros_boost,1);
  bVar4 = boost::multiprecision::eval_eq<16384u,unsigned_int,std::allocator<unsigned_int>>
                    (&result_local.m_backend,
                     (uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *)
                     &u_three_quarter_effs_and_zeros_boost);
  if (bVar4) {
    memset(&u_seven_and_effs_boost,0,0x800);
    u_seven_and_effs_boost.m_backend.
    super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_data[0] = 1;
    u_seven_and_effs_boost.m_backend.
    super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_limbs = 1;
    tVar5 = boost::multiprecision::backends::
            eval_eq<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                      (&result_boost.m_backend,&u_seven_and_effs_boost.m_backend);
  }
  else {
    tVar5 = false;
  }
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_three_quarter_effs_and_zeros_boost);
  u_one_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0]._0_4_ = 1;
  boost::multiprecision::operator-
            ((type *)&u_three_quarter_effs_and_zeros_boost,&u_max_local,
             (uint *)&u_one_quarter_effs_and_zeros_boost);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&u_seven_and_effs_boost,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&u_three_quarter_effs_and_zeros_boost,&u_max_local);
  pvVar3 = result_local.m_backend.m_value.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  sVar2 = result_local.m_backend.m_value.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       u_seven_and_effs_boost.m_backend.
       super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
       .m_wrapper.m_data[1]._0_4_;
  u_seven_and_effs_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1]._0_4_ = sVar2;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)u_seven_and_effs_boost.m_backend.
                super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .m_wrapper.m_data[2];
  u_seven_and_effs_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = (limb_type)pvVar3;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_seven_and_effs_boost);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_three_quarter_effs_and_zeros_boost);
  u_one_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0]._0_4_ = 1;
  boost::multiprecision::operator-
            (&u_three_quarter_effs_and_zeros_boost,&u_max_boost,
             (uint *)&u_one_quarter_effs_and_zeros_boost);
  boost::multiprecision::operator*
            (&u_seven_and_effs_boost,&u_three_quarter_effs_and_zeros_boost,&u_max_boost);
  memcpy(&result_boost,&u_seven_and_effs_boost,0x808);
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  uintwide_t_backend<unsigned_long,_nullptr>
            ((uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *)
             &u_three_quarter_effs_and_zeros_boost,2);
  bVar4 = boost::multiprecision::eval_eq<16384u,unsigned_int,std::allocator<unsigned_int>>
                    (&result_local.m_backend,
                     (uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *)
                     &u_three_quarter_effs_and_zeros_boost);
  if (bVar4) {
    memset(&u_seven_and_effs_boost,0,0x800);
    u_seven_and_effs_boost.m_backend.
    super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_data[0] = 2;
    u_seven_and_effs_boost.m_backend.
    super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_limbs = 1;
    tVar6 = boost::multiprecision::backends::
            eval_eq<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                      (&result_boost.m_backend,&u_seven_and_effs_boost.m_backend);
  }
  else {
    tVar6 = false;
  }
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_three_quarter_effs_and_zeros_boost);
  u_seven_and_effs_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] =
       (long)&u_seven_and_effs_boost.m_backend.
              super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
              .m_wrapper + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &u_seven_and_effs_boost,0xfff,'F');
  std::operator+(&str_seven_and_effs,"0x7",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &u_seven_and_effs_boost);
  std::__cxx11::string::~string((string *)&u_seven_and_effs_boost);
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
             &u_seven_and_effs_local,str_seven_and_effs._M_dataplus._M_p);
  u_three_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = (limb_type)str_seven_and_effs._M_dataplus._M_p;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&u_seven_and_effs_boost,(char **)&u_three_quarter_effs_and_zeros_boost,(type *)0x0);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&u_three_quarter_effs_and_zeros_boost,&u_seven_and_effs_local,
             &u_seven_and_effs_local);
  pvVar3 = result_local.m_backend.m_value.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  sVar2 = result_local.m_backend.m_value.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       u_three_quarter_effs_and_zeros_boost.m_backend.
       super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
       .m_wrapper.m_data[1]._0_4_;
  u_three_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1]._0_4_ = sVar2;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)u_three_quarter_effs_and_zeros_boost.m_backend.
                super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .m_wrapper.m_data[2];
  u_three_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = (limb_type)pvVar3;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_three_quarter_effs_and_zeros_boost);
  boost::multiprecision::operator*
            (&u_three_quarter_effs_and_zeros_boost,&u_seven_and_effs_boost,&u_seven_and_effs_boost);
  memcpy(&result_boost,&u_three_quarter_effs_and_zeros_boost,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &u_three_quarter_effs_and_zeros_boost,&result_local);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &u_one_quarter_effs_and_zeros_boost,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&result_boost);
  _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &u_three_quarter_effs_and_zeros_boost,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &u_one_quarter_effs_and_zeros_boost);
  std::__cxx11::string::~string((string *)&u_one_quarter_effs_and_zeros_boost);
  std::__cxx11::string::~string((string *)&u_three_quarter_effs_and_zeros_boost);
  u_one_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] =
       (long)&u_one_quarter_effs_and_zeros_boost.m_backend.
              super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
              .m_wrapper + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &u_one_quarter_effs_and_zeros_boost,0x3000,'F');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &u_three_quarter_effs_and_zeros_boost,"0x",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &u_one_quarter_effs_and_zeros_boost);
  plVar1 = &one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
            super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
            .m_wrapper.m_first_limb + 2;
  one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = (limb_type)plVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &one_limb_effs_prior_to_half_and_zeros_boost,0x1000,'0');
  std::operator+(&str_three_quarter_effs_and_zeros,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &u_three_quarter_effs_and_zeros_boost,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &one_limb_effs_prior_to_half_and_zeros_boost);
  std::__cxx11::string::~string((string *)&one_limb_effs_prior_to_half_and_zeros_boost);
  std::__cxx11::string::~string((string *)&u_three_quarter_effs_and_zeros_boost);
  std::__cxx11::string::~string((string *)&u_one_quarter_effs_and_zeros_boost);
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
             &u_three_quarter_effs_and_zeros_local,str_three_quarter_effs_and_zeros._M_dataplus._M_p
            );
  u_one_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = (limb_type)str_three_quarter_effs_and_zeros._M_dataplus._M_p;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&u_three_quarter_effs_and_zeros_boost,(char **)&u_one_quarter_effs_and_zeros_boost,
             (type *)0x0);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&u_one_quarter_effs_and_zeros_boost,&u_three_quarter_effs_and_zeros_local,
             &u_three_quarter_effs_and_zeros_local);
  pvVar3 = result_local.m_backend.m_value.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  sVar2 = result_local.m_backend.m_value.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       u_one_quarter_effs_and_zeros_boost.m_backend.
       super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
       .m_wrapper.m_data[1]._0_4_;
  u_one_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1]._0_4_ = sVar2;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)u_one_quarter_effs_and_zeros_boost.m_backend.
                super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .m_wrapper.m_data[2];
  u_one_quarter_effs_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = (limb_type)pvVar3;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_one_quarter_effs_and_zeros_boost);
  boost::multiprecision::operator*
            (&u_one_quarter_effs_and_zeros_boost,&u_three_quarter_effs_and_zeros_boost,
             &u_three_quarter_effs_and_zeros_boost);
  memcpy(&result_boost,&u_one_quarter_effs_and_zeros_boost,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &u_one_quarter_effs_and_zeros_boost,&result_local);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &one_limb_effs_prior_to_half_and_zeros_boost,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&result_boost);
  _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &u_one_quarter_effs_and_zeros_boost,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &one_limb_effs_prior_to_half_and_zeros_boost);
  std::__cxx11::string::~string((string *)&one_limb_effs_prior_to_half_and_zeros_boost);
  std::__cxx11::string::~string((string *)&u_one_quarter_effs_and_zeros_boost);
  one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = (limb_type)plVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &one_limb_effs_prior_to_half_and_zeros_boost,0x1000,'F');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &u_one_quarter_effs_and_zeros_boost,"0x",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &one_limb_effs_prior_to_half_and_zeros_boost);
  u_mid_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] =
       (long)&u_mid_boost.m_backend.
              super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
              .m_wrapper + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&u_mid_boost,
             0x3000,'0');
  std::operator+(&str_one_quarter_effs_and_zeros,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &u_one_quarter_effs_and_zeros_boost,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&u_mid_boost);
  std::__cxx11::string::~string((string *)&u_mid_boost);
  std::__cxx11::string::~string((string *)&u_one_quarter_effs_and_zeros_boost);
  std::__cxx11::string::~string((string *)&one_limb_effs_prior_to_half_and_zeros_boost);
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
             &u_one_quarter_effs_and_zeros_local,str_one_quarter_effs_and_zeros._M_dataplus._M_p);
  one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = (limb_type)str_one_quarter_effs_and_zeros._M_dataplus._M_p;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&u_one_quarter_effs_and_zeros_boost,
             (char **)&one_limb_effs_prior_to_half_and_zeros_boost,(type *)0x0);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&one_limb_effs_prior_to_half_and_zeros_boost,&u_one_quarter_effs_and_zeros_local,
             &u_one_quarter_effs_and_zeros_local);
  pvVar3 = result_local.m_backend.m_value.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  sVar2 = result_local.m_backend.m_value.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
       super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
       .m_wrapper.m_data[1]._0_4_;
  one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1]._0_4_ = sVar2;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
                super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .m_wrapper.m_data[2];
  one_limb_effs_prior_to_half_and_zeros_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = (limb_type)pvVar3;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &one_limb_effs_prior_to_half_and_zeros_boost);
  boost::multiprecision::operator*
            (&one_limb_effs_prior_to_half_and_zeros_boost,&u_one_quarter_effs_and_zeros_boost,
             &u_one_quarter_effs_and_zeros_boost);
  memcpy(&result_boost,&one_limb_effs_prior_to_half_and_zeros_boost,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &one_limb_effs_prior_to_half_and_zeros_boost,&result_local);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&u_mid_boost,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&result_boost);
  _Var9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &one_limb_effs_prior_to_half_and_zeros_boost,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &u_mid_boost);
  std::__cxx11::string::~string((string *)&u_mid_boost);
  std::__cxx11::string::~string((string *)&one_limb_effs_prior_to_half_and_zeros_boost);
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  uintwide_t_backend<unsigned_long,_nullptr>
            ((uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> *)
             &one_limb_effs_prior_to_half_and_zeros_boost,0xffffffff);
  u_mid_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0]._0_4_ = 0x1fe0;
  boost::multiprecision::operator<<
            (&one_limb_effs_prior_to_half_and_zeros_local,
             (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&one_limb_effs_prior_to_half_and_zeros_boost,(int *)&u_mid_boost);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &one_limb_effs_prior_to_half_and_zeros_boost);
  memset(&u_mid_boost,0,0x800);
  u_mid_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = 0xffffffff;
  u_mid_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_limbs = 1;
  dt.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array =
       (_func_int **)
       CONCAT44(dt.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array._4_4_,0x1fe0);
  boost::multiprecision::operator<<
            (&one_limb_effs_prior_to_half_and_zeros_boost,&u_mid_boost,(int *)&dt);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
              *)&u_mid_boost,&one_limb_effs_prior_to_half_and_zeros_local,
             &one_limb_effs_prior_to_half_and_zeros_local);
  pvVar3 = result_local.m_backend.m_value.values.
           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
  sVar2 = result_local.m_backend.m_value.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
       u_mid_boost.m_backend.
       super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
       .m_wrapper.m_data[1]._0_4_;
  u_mid_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1]._0_4_ = sVar2;
  result_local.m_backend.m_value.values.
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
       (pointer)u_mid_boost.m_backend.
                super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .m_wrapper.m_data[2];
  u_mid_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = (limb_type)pvVar3;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_mid_boost);
  boost::multiprecision::operator*
            (&u_mid_boost,&one_limb_effs_prior_to_half_and_zeros_boost,
             &one_limb_effs_prior_to_half_and_zeros_boost);
  memcpy(&result_boost,&u_mid_boost,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&u_mid_boost,
             &result_local);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&result_boost);
  _Var10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &u_mid_boost,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt)
  ;
  std::__cxx11::string::~string((string *)&dt);
  std::__cxx11::string::~string((string *)&u_mid_boost);
  u_mid_boost.m_backend.
  super_cpp_int_base<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0]._0_4_ = 2;
  boost::multiprecision::operator/
            (&u_mid_local,&u_three_quarter_effs_and_zeros_local,(uint *)&u_mid_boost);
  dt.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)0x2;
  boost::multiprecision::operator/
            (&u_mid_boost,&u_three_quarter_effs_and_zeros_boost,(unsigned_long_long *)&dt);
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  operator=(&result_local.m_backend,&u_mid_local.m_backend);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  operator>>=((uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *)&result_local,
              -0x27);
  memset(&local_848,0,0x800);
  local_848.m_data[0] = 1;
  local_48 = 1;
  local_51cc = 0x27;
  boost::multiprecision::operator<<
            ((type *)&local_1868,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_848,&local_51cc);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&dt,&u_mid_boost,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_1868);
  memcpy(&result_boost,&dt,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt,&result_local)
  ;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1868,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&result_boost);
  _Var11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1868);
  std::__cxx11::string::~string((string *)&local_1868);
  std::__cxx11::string::~string((string *)&dt);
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  operator=(&result_local.m_backend,&u_mid_local.m_backend);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  operator<<=((uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *)&result_local,
              -0x27);
  memset(&local_848,0,0x800);
  local_848.m_data[0] = 1;
  local_48 = 1;
  local_51cc = 0x27;
  boost::multiprecision::operator<<
            ((type *)&local_1868,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_848,&local_51cc);
  boost::multiprecision::operator/
            ((number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&dt,&u_mid_boost,
             (number<boost::multiprecision::backends::cpp_int_backend<16384U,_16384U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_1868);
  memcpy(&result_boost,&dt,0x808);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt,&result_local)
  ;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  ::convert_to<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1868,
             (number<boost::multiprecision::backends::cpp_int_backend<16384u,16384u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
              *)&result_boost);
  _Var12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1868);
  std::__cxx11::string::~string((string *)&local_1868);
  std::__cxx11::string::~string((string *)&dt);
  math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&(std::numeric_limits<unsigned_int>::digits<=std::
  numeric_limits<unsigned_int>::digits),void>::type__
            (&dt,0xfffffffd,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  for (lVar14 = 0;
      (ulong)dt.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count << 2 != lVar14; lVar14 = lVar14 + 4) {
    *(undefined4 *)
     ((long)dt.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
     + lVar14) = 0;
  }
  local_1868.m_data[0]._0_4_ = 0;
  eVar13 = math::wide_integer::operator==(&dt,(uint *)local_1868.m_data);
  for (lVar14 = 0;
      (ulong)dt.values.
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elem_count << 2 != lVar14; lVar14 = lVar14 + 4) {
    *(undefined4 *)
     ((long)dt.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
     + lVar14) = 0xffffffff;
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  limits_helper_max<false>();
  bVar4 = math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>
          ::operator==(&dt,(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           &local_1868);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &local_1868);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)&dt);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_mid_local);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &one_limb_effs_prior_to_half_and_zeros_local);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_one_quarter_effs_and_zeros_local);
  std::__cxx11::string::~string((string *)&str_one_quarter_effs_and_zeros);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_three_quarter_effs_and_zeros_local);
  std::__cxx11::string::~string((string *)&str_three_quarter_effs_and_zeros);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_seven_and_effs_local);
  std::__cxx11::string::~string((string *)&str_seven_and_effs);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &result_local);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             &u_max_local);
  return (bool)((eVar13 && bVar4) &
               (_Var11 && _Var12) & tVar5 & tVar6 & ((_Var9 && _Var10) && (_Var7 && _Var8)));
}

Assistant:

auto test_various_edge_operations() -> bool
{
  const auto u_max_local = (std::numeric_limits<local_uint_type>::max)();
  const auto u_max_boost = (std::numeric_limits<boost_uint_type>::max)();

  local_uint_type result_local;
  boost_uint_type result_boost;

  result_local = u_max_local * u_max_local;
  result_boost = u_max_boost * u_max_boost;

  const auto result01_is_ok = ((result_local == local_uint_type(static_cast<unsigned>(UINT8_C(1)))) && (result_boost == boost_uint_type(static_cast<unsigned>(UINT8_C(1)))));

  result_local = (u_max_local - 1U) * u_max_local;
  result_boost = (u_max_boost - 1U) * u_max_boost;

  const auto result02_is_ok = ((result_local == local_uint_type(static_cast<unsigned>(UINT8_C(2)))) && (result_boost == boost_uint_type(static_cast<unsigned>(UINT8_C(2)))));

  const std::string str_seven_and_effs =
    "0x7" + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) - static_cast<unsigned>(UINT8_C(1))), 'F');

  const local_uint_type u_seven_and_effs_local(str_seven_and_effs.c_str());
  const boost_uint_type u_seven_and_effs_boost(str_seven_and_effs.c_str());

  result_local = u_seven_and_effs_local * u_seven_and_effs_local;
  result_boost = u_seven_and_effs_boost * u_seven_and_effs_boost;

  const auto result03_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const std::string str_three_quarter_effs_and_zeros =
      "0x"
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(3))), 'F')
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(1))), '0')
    ;

  const local_uint_type u_three_quarter_effs_and_zeros_local(str_three_quarter_effs_and_zeros.c_str());
  const boost_uint_type u_three_quarter_effs_and_zeros_boost(str_three_quarter_effs_and_zeros.c_str());

  result_local = u_three_quarter_effs_and_zeros_local * u_three_quarter_effs_and_zeros_local;
  result_boost = u_three_quarter_effs_and_zeros_boost * u_three_quarter_effs_and_zeros_boost;

  const auto result04_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const std::string str_one_quarter_effs_and_zeros =
      "0x"
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(1))), 'F')
    + std::string(static_cast<std::string::size_type>((local_edge_cases::local_digits2 / 4) * static_cast<unsigned>(UINT8_C(3))), '0')
    ;

  const local_uint_type u_one_quarter_effs_and_zeros_local(str_one_quarter_effs_and_zeros.c_str());
  const boost_uint_type u_one_quarter_effs_and_zeros_boost(str_one_quarter_effs_and_zeros.c_str());

  result_local = u_one_quarter_effs_and_zeros_local * u_one_quarter_effs_and_zeros_local;
  result_boost = u_one_quarter_effs_and_zeros_boost * u_one_quarter_effs_and_zeros_boost;

  const bool result05_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const local_uint_type one_limb_effs_prior_to_half_and_zeros_local(local_uint_type(UINT32_C(0xFFFFFFFF)) << ((std::numeric_limits<local_uint_type>::digits / 2) - 32));
  const boost_uint_type one_limb_effs_prior_to_half_and_zeros_boost(boost_uint_type(UINT32_C(0xFFFFFFFF)) << ((std::numeric_limits<boost_uint_type>::digits / 2) - 32));

  result_local = one_limb_effs_prior_to_half_and_zeros_local * one_limb_effs_prior_to_half_and_zeros_local;
  result_boost = one_limb_effs_prior_to_half_and_zeros_boost * one_limb_effs_prior_to_half_and_zeros_boost;

  const auto result06_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  const local_uint_type u_mid_local = u_three_quarter_effs_and_zeros_local / static_cast<typename local_uint_type::backend_type::representation_type::limb_type>(UINT8_C(2));
  const boost_uint_type u_mid_boost = u_three_quarter_effs_and_zeros_boost / static_cast<typename std::iterator_traits<boost_uint_type::backend_type::limb_pointer>::value_type>(UINT8_C(2));

  constexpr auto signed_shift_amount =
    static_cast<int>
    (
      -(std::numeric_limits<typename local_uint_type::backend_type::representation_type::limb_type>::digits + 7)
    );

  result_local = u_mid_local;
  result_local.backend().representation() >>= signed_shift_amount;
  result_boost = u_mid_boost * (boost_uint_type(1U) << (-signed_shift_amount));

  const auto result07_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  result_local = u_mid_local;
  result_local.backend().representation() <<= signed_shift_amount;
  result_boost = u_mid_boost / (boost_uint_type(1U) << (-signed_shift_amount));

  const auto result08_is_ok = (result_local.convert_to<std::string>() == result_boost.convert_to<std::string>());

  auto result_is_ok = (   result01_is_ok
                       && result02_is_ok
                       && result03_is_ok
                       && result04_is_ok
                       && result05_is_ok
                       && result06_is_ok
                       && result07_is_ok
                       && result08_is_ok);

  {
    using local_derived_uint_type = typename local_uint_type::backend_type::representation_type;
    using local_limb_type         = local_derived_uint_type::limb_type;

    local_derived_uint_type dt(static_cast<local_limb_type>(INT8_C(-3)));

    std::fill(dt.representation().begin(), dt.representation().end(), static_cast<local_limb_type>(UINT8_C(0)));

    const auto result_fill_with_zero_is_ok = (dt == 0U);

    result_is_ok = (result_fill_with_zero_is_ok && result_is_ok);

    std::fill(dt.representation().begin(), dt.representation().end(), (std::numeric_limits<local_limb_type>::max)());

    const auto result_fill_with_effs_is_ok = (dt == (std::numeric_limits<local_derived_uint_type>::max)());

    result_is_ok = (result_fill_with_effs_is_ok && result_is_ok);
  }

  return result_is_ok;
}